

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseExtGNU_StatementExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  ExtGNU_EnclosedCompoundStatementExpressionSyntax *pEVar3;
  IndexType IVar4;
  long lVar5;
  CompoundStatementSyntax *pCVar6;
  ostream *poVar7;
  StatementSyntax *statement;
  string local_40;
  
  pSVar2 = peek(this,1);
  if ((pSVar2->syntaxK_ == OpenParenToken) &&
     (pSVar2 = peek(this,2), pSVar2->syntaxK_ == OpenBraceToken)) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_StatementExpressions(this_01);
    if (!bVar1) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"GNU statement expressions","");
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    pEVar3 = makeNode<psy::C::ExtGNU_EnclosedCompoundStatementExpressionSyntax>(this);
    *expr = &pEVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pEVar3->openParenTkIdx_ = IVar4;
    local_40._M_dataplus._M_p = (pointer)0x0;
    parseCompoundStatement_AtFirst(this,(StatementSyntax **)&local_40,None);
    lVar5 = (**(code **)(*(long *)local_40._M_dataplus._M_p + 0x540))();
    if (lVar5 != 0) {
      pCVar6 = (CompoundStatementSyntax *)
               (**(code **)(*(long *)local_40._M_dataplus._M_p + 0x540))();
      pEVar3->stmt_ = pCVar6;
    }
    bVar1 = matchOrSkipTo(this,CloseParenToken,&pEVar3->closeParenTkIdx_);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"assert failure: `(\' then `{\'",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return false;
}

Assistant:

bool Parser::parseExtGNU_StatementExpression_AtFirst(ExpressionSyntax *&expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken
                        && peek(2).kind() == SyntaxKind::OpenBraceToken,
                  return false,
                  "assert failure: `(' then `{'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_StatementExpressions())
        diagReporter_.ExpectedFeature("GNU statement expressions");

    auto gnuExpr = makeNode<ExtGNU_EnclosedCompoundStatementExpressionSyntax>();
    expr = gnuExpr;
    gnuExpr->openParenTkIdx_ = consume();

    StatementSyntax* statement = nullptr;
    parseCompoundStatement_AtFirst(statement, StatementContext::None);
    if (statement->asCompoundStatement())
        gnuExpr->stmt_ = statement->asCompoundStatement();
    return matchOrSkipTo(SyntaxKind::CloseParenToken, &gnuExpr->closeParenTkIdx_);
}